

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::preceding
          (DictionaryCache *this,int32_t fromPos,int32_t *result,int32_t *statusIndex)

{
  int iVar1;
  int32_t iVar2;
  int32_t local_4c;
  int32_t local_48;
  int32_t r;
  int32_t *statusIndex_local;
  int32_t *result_local;
  int32_t fromPos_local;
  DictionaryCache *this_local;
  
  if ((this->fStart < fromPos) && (fromPos <= this->fLimit)) {
    if (fromPos == this->fLimit) {
      iVar2 = UVector32::size(&this->fBreaks);
      this->fPositionInCache = iVar2 + -1;
    }
    if (((this->fPositionInCache < 1) ||
        (iVar1 = this->fPositionInCache, iVar2 = UVector32::size(&this->fBreaks), iVar2 <= iVar1))
       || (iVar2 = UVector32::elementAti(&this->fBreaks,this->fPositionInCache), iVar2 != fromPos))
    {
      if (this->fPositionInCache == 0) {
        this->fPositionInCache = -1;
        this_local._7_1_ = '\0';
      }
      else {
        iVar2 = UVector32::size(&this->fBreaks);
        this->fPositionInCache = iVar2 + -1;
        while (-1 < this->fPositionInCache) {
          iVar2 = UVector32::elementAti(&this->fBreaks,this->fPositionInCache);
          if (iVar2 < fromPos) {
            *result = iVar2;
            if (iVar2 == this->fStart) {
              local_4c = this->fFirstRuleStatusIndex;
            }
            else {
              local_4c = this->fOtherRuleStatusIndex;
            }
            *statusIndex = local_4c;
            return '\x01';
          }
          this->fPositionInCache = this->fPositionInCache + -1;
        }
        this->fPositionInCache = -1;
        this_local._7_1_ = '\0';
      }
    }
    else {
      this->fPositionInCache = this->fPositionInCache + -1;
      iVar2 = UVector32::elementAti(&this->fBreaks,this->fPositionInCache);
      *result = iVar2;
      if (iVar2 == this->fStart) {
        local_48 = this->fFirstRuleStatusIndex;
      }
      else {
        local_48 = this->fOtherRuleStatusIndex;
      }
      *statusIndex = local_48;
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this->fPositionInCache = -1;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool RuleBasedBreakIterator::DictionaryCache::preceding(int32_t fromPos, int32_t *result, int32_t *statusIndex) {
    if (fromPos <= fStart || fromPos > fLimit) {
        fPositionInCache = -1;
        return FALSE;
    }

    if (fromPos == fLimit) {
        fPositionInCache = fBreaks.size() - 1;
        if (fPositionInCache >= 0) {
            U_ASSERT(fBreaks.elementAti(fPositionInCache) == fromPos);
        }
    }

    int32_t r;
    if (fPositionInCache > 0 && fPositionInCache < fBreaks.size() && fBreaks.elementAti(fPositionInCache) == fromPos) {
        --fPositionInCache;
        r = fBreaks.elementAti(fPositionInCache);
        U_ASSERT(r < fromPos);
        *result = r;
        *statusIndex = ( r== fStart) ? fFirstRuleStatusIndex : fOtherRuleStatusIndex;
        return TRUE;
    }

    if (fPositionInCache == 0) {
        fPositionInCache = -1;
        return FALSE;
    }

    for (fPositionInCache = fBreaks.size()-1; fPositionInCache >= 0; --fPositionInCache) {
        r = fBreaks.elementAti(fPositionInCache);
        if (r < fromPos) {
            *result = r;
            *statusIndex = ( r == fStart) ? fFirstRuleStatusIndex : fOtherRuleStatusIndex;
            return TRUE;
        }
    }
    U_ASSERT(FALSE);
    fPositionInCache = -1;
    return FALSE;
}